

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGear.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsGear::ArchiveOUT(ChShaftsGear *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsGear>(marchive);
  ChArchiveOut::VersionWrite<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveOUT((ChPhysicsItem *)this,marchive);
  local_30 = &this->ratio;
  local_38 = "ratio";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (double *)&this->avoid_phase_drift;
  local_38 = "avoid_phase_drift";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = &this->phase1;
  local_38 = "phase1";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->phase2;
  local_38 = "phase2";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsGear::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsGear>();

    // serialize parent class
    ChShaftsCouple::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(ratio);
    marchive << CHNVP(avoid_phase_drift);
    marchive << CHNVP(phase1);
    marchive << CHNVP(phase2);
}